

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

void __thiscall
happly::TypedListProperty<signed_char>::readNextBigEndian
          (TypedListProperty<signed_char> *this,istream *stream)

{
  char cVar1;
  unsigned_short uVar2;
  uint uVar3;
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  reference pvVar4;
  char *in_RSI;
  unsigned_long *in_RDI;
  size_t iFlat;
  size_t afterSize;
  size_t currSize;
  size_t count;
  char *in_stack_ffffffffffffffc0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  vector<signed_char,_std::allocator<signed_char>_> *__new_size;
  unsigned_long local_18;
  char *local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  std::istream::read(in_RSI,(long)&local_18);
  if ((int)in_RDI[0xb] == 8) {
    local_18 = anon_unknown_3::swapEndian<unsigned_long>((unsigned_long)in_stack_ffffffffffffffc0);
  }
  else if ((int)in_RDI[0xb] == 4) {
    uVar3 = anon_unknown_3::swapEndian<unsigned_int>
                      ((uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    local_18 = (unsigned_long)uVar3;
  }
  else if ((int)in_RDI[0xb] == 2) {
    uVar2 = anon_unknown_3::swapEndian<unsigned_short>
                      ((unsigned_short)((ulong)in_stack_ffffffffffffffc0 >> 0x30));
    local_18 = (unsigned_long)uVar2;
  }
  this_00 = (vector<signed_char,_std::allocator<signed_char>_> *)
            geometrycentral::surface::std::vector<signed_char,_std::allocator<signed_char>_>::size
                      ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 5));
  __new_size = (vector<signed_char,_std::allocator<signed_char>_> *)
               ((long)&(this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + local_18);
  geometrycentral::surface::std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (this_00,(size_type)__new_size);
  if (local_18 != 0) {
    pvVar4 = geometrycentral::surface::std::vector<signed_char,_std::allocator<signed_char>_>::
             operator[]((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 5),
                        (size_type)this_00);
    std::istream::read(local_10,(long)pvVar4);
    in_stack_ffffffffffffffc0 = local_10;
  }
  std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
            (in_stack_ffffffffffffffd0,in_RDI);
  for (; this_00 < __new_size;
      this_00 = (vector<signed_char,_std::allocator<signed_char>_> *)
                ((long)&(this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                        _M_impl.super__Vector_impl_data._M_start + 1)) {
    geometrycentral::surface::std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
              ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 5),(size_type)this_00)
    ;
    cVar1 = anon_unknown_3::swapEndian<signed_char>
                      ((char)((ulong)in_stack_ffffffffffffffc0 >> 0x38));
    pvVar4 = geometrycentral::surface::std::vector<signed_char,_std::allocator<signed_char>_>::
             operator[]((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 5),
                        (size_type)this_00);
    *pvVar4 = cVar1;
  }
  return;
}

Assistant:

virtual void readNextBigEndian(std::istream& stream) override {

    // Read the size of the list
    size_t count = 0;
    stream.read(((char*)&count), listCountBytes);
    if (listCountBytes == 8) {
      count = (size_t)swapEndian((uint64_t)count);
    } else if (listCountBytes == 4) {
      count = (size_t)swapEndian((uint32_t)count);
    } else if (listCountBytes == 2) {
      count = (size_t)swapEndian((uint16_t)count);
    }

    // Read list elements
    size_t currSize = flattenedData.size();
    size_t afterSize = currSize + count;
    flattenedData.resize(afterSize);
    if (count > 0) {
      stream.read((char*)&flattenedData[currSize], count * sizeof(T));
    }
    flattenedIndexStart.emplace_back(afterSize);

    // Swap endian order of list elements
    for (size_t iFlat = currSize; iFlat < afterSize; iFlat++) {
      flattenedData[iFlat] = swapEndian(flattenedData[iFlat]);
    }
  }